

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void lzma_end(lzma_stream *strm)

{
  lzma_allocator *plVar1;
  
  if ((strm != (lzma_stream *)0x0) && (strm->internal != (lzma_internal *)0x0)) {
    lzma_next_end(&strm->internal->next,strm->allocator);
    plVar1 = strm->allocator;
    if ((plVar1 == (lzma_allocator *)0x0) || (plVar1->free == (_func_void_void_ptr_void_ptr *)0x0))
    {
      free(strm->internal);
    }
    else {
      (*plVar1->free)(plVar1->opaque,strm->internal);
    }
    strm->internal = (lzma_internal *)0x0;
  }
  return;
}

Assistant:

extern LZMA_API(void)
lzma_end(lzma_stream *strm)
{
	if (strm != NULL && strm->internal != NULL) {
		lzma_next_end(&strm->internal->next, strm->allocator);
		lzma_free(strm->internal, strm->allocator);
		strm->internal = NULL;
	}

	return;
}